

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::SetUnowned
          (MicroString *this,UnownedPayload *unowned_input,Arena *arena)

{
  LargeRepKind t;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_40;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena_local;
  UnownedPayload *unowned_input_local;
  MicroString *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)arena;
  arena_local = (Arena *)unowned_input;
  unowned_input_local = (UnownedPayload *)this;
  if (arena == (Arena *)0x0) {
    Destroy(this);
  }
  this->rep_ = (void *)((ulong)arena_local | 1);
  t = large_rep_kind(this);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(1);
  local_28 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"+large_rep_kind() == +kUnowned");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
               ,0x11f,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return;
}

Assistant:

void MicroString::SetUnowned(const UnownedPayload& unowned_input,
                             Arena* arena) {
  if (arena == nullptr) Destroy();
  rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(&unowned_input) |
                                 kIsLargeRepTag);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kUnowned);
}